

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O0

int CBB_flush_asn1_set_of(CBB *cbb)

{
  int iVar1;
  uint8_t *puVar2;
  size_t sVar3;
  void *__base;
  uint8_t *puVar4;
  uint8_t *src;
  size_t sVar5;
  ulong local_70;
  size_t i_1;
  size_t i;
  size_t offset;
  uint8_t *out;
  CBS *children;
  uint8_t *buf;
  size_t buf_len;
  ulong uStack_30;
  int ret;
  size_t num_children;
  CBS cbs;
  CBB *cbb_local;
  
  cbs.len = (size_t)cbb;
  iVar1 = CBB_flush(cbb);
  if (iVar1 == 0) {
    cbb_local._4_4_ = 0;
  }
  else {
    uStack_30 = 0;
    puVar2 = CBB_data((CBB *)cbs.len);
    sVar3 = CBB_len((CBB *)cbs.len);
    CBS_init((CBS *)&num_children,puVar2,sVar3);
    while (sVar3 = CBS_len((CBS *)&num_children), sVar3 != 0) {
      iVar1 = CBS_get_any_asn1_element
                        ((CBS *)&num_children,(CBS *)0x0,(CBS_ASN1_TAG *)0x0,(size_t *)0x0);
      if (iVar1 == 0) {
        ERR_put_error(0xe,0,0x42,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                      ,0x297);
        return 0;
      }
      uStack_30 = uStack_30 + 1;
    }
    if (uStack_30 < 2) {
      cbb_local._4_4_ = 1;
    }
    else {
      buf_len._4_4_ = 0;
      sVar3 = CBB_len((CBB *)cbs.len);
      puVar2 = CBB_data((CBB *)cbs.len);
      puVar2 = (uint8_t *)OPENSSL_memdup(puVar2,sVar3);
      __base = OPENSSL_calloc(uStack_30,0x10);
      i = 0;
      if ((puVar2 != (uint8_t *)0x0) && (__base != (void *)0x0)) {
        CBS_init((CBS *)&num_children,puVar2,sVar3);
        for (i_1 = 0; i_1 < uStack_30; i_1 = i_1 + 1) {
          iVar1 = CBS_get_any_asn1_element
                            ((CBS *)&num_children,(CBS *)((long)__base + i_1 * 0x10),
                             (CBS_ASN1_TAG *)0x0,(size_t *)0x0);
          if (iVar1 == 0) goto LAB_00625a4b;
        }
        qsort(__base,uStack_30,0x10,compare_set_of_element);
        puVar4 = CBB_data((CBB *)cbs.len);
        for (local_70 = 0; local_70 < uStack_30; local_70 = local_70 + 1) {
          src = CBS_data((CBS *)((long)__base + local_70 * 0x10));
          sVar5 = CBS_len((CBS *)((long)__base + local_70 * 0x10));
          OPENSSL_memcpy(puVar4 + i,src,sVar5);
          sVar5 = CBS_len((CBS *)((long)__base + local_70 * 0x10));
          i = sVar5 + i;
        }
        if (i != sVar3) {
          __assert_fail("offset == buf_len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                        ,700,"int CBB_flush_asn1_set_of(CBB *)");
        }
        buf_len._4_4_ = 1;
      }
LAB_00625a4b:
      OPENSSL_free(puVar2);
      OPENSSL_free(__base);
      cbb_local._4_4_ = buf_len._4_4_;
    }
  }
  return cbb_local._4_4_;
}

Assistant:

int CBB_flush_asn1_set_of(CBB *cbb) {
  if (!CBB_flush(cbb)) {
    return 0;
  }

  CBS cbs;
  size_t num_children = 0;
  CBS_init(&cbs, CBB_data(cbb), CBB_len(cbb));
  while (CBS_len(&cbs) != 0) {
    if (!CBS_get_any_asn1_element(&cbs, NULL, NULL, NULL)) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
      return 0;
    }
    num_children++;
  }

  if (num_children < 2) {
    return 1;  // Nothing to do. This is the common case for X.509.
  }

  // Parse out the children and sort. We alias them into a copy of so they
  // remain valid as we rewrite |cbb|.
  int ret = 0;
  size_t buf_len = CBB_len(cbb);
  uint8_t *buf =
      reinterpret_cast<uint8_t *>(OPENSSL_memdup(CBB_data(cbb), buf_len));
  CBS *children =
      reinterpret_cast<CBS *>(OPENSSL_calloc(num_children, sizeof(CBS)));
  uint8_t *out;
  size_t offset = 0;
  if (buf == NULL || children == NULL) {
    goto err;
  }
  CBS_init(&cbs, buf, buf_len);
  for (size_t i = 0; i < num_children; i++) {
    if (!CBS_get_any_asn1_element(&cbs, &children[i], NULL, NULL)) {
      goto err;
    }
  }
  qsort(children, num_children, sizeof(CBS), compare_set_of_element);

  // Write the contents back in the new order.
  out = (uint8_t *)CBB_data(cbb);
  for (size_t i = 0; i < num_children; i++) {
    OPENSSL_memcpy(out + offset, CBS_data(&children[i]), CBS_len(&children[i]));
    offset += CBS_len(&children[i]);
  }
  assert(offset == buf_len);

  ret = 1;

err:
  OPENSSL_free(buf);
  OPENSSL_free(children);
  return ret;
}